

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

void testCopyMultiPartFile(string *tempDir)

{
  int iVar1;
  string *in_RCX;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing copying multi-part files",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  random_reseed(1);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  iVar1 = (int)tempDir;
  anon_unknown.dwarf_e60ea::testWriteCopyRead(2,0x14,iVar1,in_RCX);
  anon_unknown.dwarf_e60ea::testWriteCopyRead(1,10,iVar1,in_RCX);
  anon_unknown.dwarf_e60ea::testWriteCopyRead(5,4,iVar1,in_RCX);
  anon_unknown.dwarf_e60ea::testWriteCopyRead(0x32,1,iVar1,in_RCX);
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testCopyMultiPartFile (const std::string& tempDir)
{
    try
    {
        cout << "Testing copying multi-part files" << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteCopyRead (2, 20, 10, tempDir);
        testWriteCopyRead (1, 10, 5, tempDir);
        testWriteCopyRead (5, 4, 25, tempDir);
        testWriteCopyRead (50, 1, 250, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}